

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O3

dynamic_bit_vector * __thiscall
bsim::orr(dynamic_bit_vector *__return_storage_ptr__,bsim *this,dynamic_bit_vector *a)

{
  uint uVar1;
  dynamic_bit_vector *extraout_RAX;
  dynamic_bit_vector *extraout_RAX_00;
  dynamic_bit_vector *pdVar2;
  dynamic_bit_vector *extraout_RAX_01;
  string local_30;
  
  if (0 < (int)(uint)a) {
    uVar1 = 0;
    do {
      if (((byte)this[uVar1 >> 3] >> (uVar1 & 7) & 1) != 0) {
        local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"1","");
        dynamic_bit_vector::dynamic_bit_vector(__return_storage_ptr__,1,&local_30);
        pdVar2 = extraout_RAX_00;
        goto LAB_00174199;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)a != uVar1);
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"0","");
  dynamic_bit_vector::dynamic_bit_vector(__return_storage_ptr__,1,&local_30);
  pdVar2 = extraout_RAX;
LAB_00174199:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
    pdVar2 = extraout_RAX_01;
  }
  return pdVar2;
}

Assistant:

static inline dynamic_bit_vector
  orr(const dynamic_bit_vector& a) {
    for (int i = 0; i < a.bitLength(); i++) {
      if (a.get(i) == 1) {
	return dynamic_bit_vector(1, "1");
      }
    }

    return dynamic_bit_vector(1, "0");
  }